

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileConstant(jx9_gen_state *pGen)

{
  sxu32 nLine;
  uint uVar1;
  SyToken *pSVar2;
  SyToken *pSVar3;
  jx9_vm *pjVar4;
  SySet *pSVar5;
  sxi32 sVar6;
  int iVar7;
  SyToken *pSVar8;
  SySet *pSet;
  SySet *pSVar9;
  char *pcVar10;
  sxu32 SLen;
  char *zRight;
  
  pSVar2 = pGen->pIn;
  pSVar3 = pGen->pEnd;
  nLine = pSVar2->nLine;
  pSVar8 = pSVar2 + 1;
  pGen->pIn = pSVar8;
  if ((pSVar8 < pSVar3) && ((pSVar2[1].nType & 0x600c) != 0)) {
    uVar1 = pSVar2[1].sData.nByte;
    if (uVar1 == 5) {
      pcVar10 = (pSVar8->sData).zString;
      zRight = "false";
      SLen = 5;
LAB_00124144:
      sVar6 = SyStrnicmp(pcVar10,zRight,SLen);
      if (sVar6 != 0) {
LAB_0012414d:
        pGen->pIn = pSVar2 + 2;
        if ((pSVar2 + 2 < pSVar3) && ((pSVar2[2].nType & 0x400000) != 0)) {
          pGen->pIn = pSVar2 + 3;
          pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x28);
          if (pSet == (SySet *)0x0) {
            GenStateOutOfMem(pGen);
            return -10;
          }
          pjVar4 = pGen->pVm;
          pSet->nUsed = 0;
          pSet->nSize = 0;
          pSet->eSize = 0x18;
          pSet->nCursor = 0;
          pSet->pAllocator = &pjVar4->sAllocator;
          pSet->pBase = (void *)0x0;
          pSet->pUserData = (void *)0x0;
          pSVar5 = pjVar4->pByteContainer;
          pjVar4->pByteContainer = pSet;
          sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar6 != -3),0,(void *)0x0,(sxu32 *)0x0);
          pjVar4 = pGen->pVm;
          pSVar9 = &pjVar4->aByteCode;
          if (pSVar5 != (SySet *)0x0) {
            pSVar9 = pSVar5;
          }
          pjVar4->pByteContainer = pSVar9;
          if (sVar6 == -10) {
            return -10;
          }
          pSet->pUserData = pjVar4;
          sVar6 = jx9VmRegisterConstant(pjVar4,&pSVar8->sData,jx9VmExpandConstantValue,pSet);
          if (sVar6 != 0) {
            SySetRelease(pSet);
            SyMemBackendPoolFree(&pGen->pVm->sAllocator,pSet);
            return 0;
          }
          return 0;
        }
        pcVar10 = "const: Expected \'=\' after constant name";
        goto LAB_001240e4;
      }
    }
    else {
      if (uVar1 != 4) goto LAB_0012414d;
      pcVar10 = (pSVar8->sData).zString;
      sVar6 = SyStrnicmp(pcVar10,"null",4);
      if (sVar6 != 0) {
        zRight = "true";
        SLen = 4;
        goto LAB_00124144;
      }
    }
    iVar7 = jx9GenCompileError(pGen,1,nLine,"const: Cannot redeclare a reserved constant \'%z\'",
                               pSVar8);
  }
  else {
    pcVar10 = "const: Invalid constant name";
LAB_001240e4:
    iVar7 = jx9GenCompileError(pGen,1,nLine,pcVar10);
  }
  if (iVar7 == -10) {
    return -10;
  }
  pSVar8 = pGen->pIn;
  while( true ) {
    if (pGen->pEnd <= pSVar8) {
      return 0;
    }
    if ((pSVar8->nType & 0x40000) != 0) break;
    pSVar8 = pSVar8 + 1;
    pGen->pIn = pSVar8;
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileConstant(jx9_gen_state *pGen)
{
	SySet *pConsCode, *pInstrContainer;
	sxu32 nLine = pGen->pIn->nLine;
	SyString *pName;
	sxi32 rc;
	pGen->pIn++; /* Jump the 'const' keyword */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_SSTR|JX9_TK_DSTR|JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid constant name */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Invalid constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Peek constant name */
	pName = &pGen->pIn->sData;
	/* Make sure the constant name isn't reserved */
	if( GenStateIsReservedID(pName) ){
		/* Reserved constant */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Cannot redeclare a reserved constant '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++;
	if(pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_EQUAL /* '=' */) == 0 ){
		/* Invalid statement*/
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Expected '=' after constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++; /*Jump the equal sign */
	/* Allocate a new constant value container */
	pConsCode = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(SySet));
	if( pConsCode == 0 ){
		return GenStateOutOfMem(pGen);
	}
	SySetInit(pConsCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
	/* Swap bytecode container */
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, pConsCode);
	/* Compile constant value */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	SySetSetUserData(pConsCode, pGen->pVm);
	/* Register the constant */
	rc = jx9VmRegisterConstant(pGen->pVm, pName, jx9VmExpandConstantValue, pConsCode);
	if( rc != SXRET_OK ){
		SySetRelease(pConsCode);
		SyMemBackendPoolFree(&pGen->pVm->sAllocator, pConsCode);
	}
	return SXRET_OK;
Synchronize:
	/* Synchronize with the next-semi-colon and avoid compiling this erroneous statement */
	while(pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}